

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::property::parse_bytes(property *this,text_input_buffer *input)

{
  char cVar1;
  bool bVar2;
  uint8_t val;
  string local_a8;
  property_value v;
  
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 != '[') {
    __assert_fail("*input == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x185,"void dtc::fdt::property::parse_bytes(text_input_buffer &)");
  }
  text_input_buffer::operator++(input);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  property_value::property_value(&v,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  text_input_buffer::next_token(input);
  do {
    bVar2 = text_input_buffer::consume(input,']');
    if (bVar2) {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,&v);
LAB_0012c5c0:
      property_value::~property_value(&v);
      return;
    }
    bVar2 = text_input_buffer::consume_hex_byte(input,&val);
    if (!bVar2) {
      text_input_buffer::parse_error(input,"Expected hex bytes in array of bytes");
      this->valid = false;
      goto LAB_0012c5c0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&v.byte_data,&val);
    text_input_buffer::next_token(input);
  } while( true );
}

Assistant:

void
property::parse_bytes(text_input_buffer &input)
{
	assert(*input == '[');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume(']'))
	{
		{
			//FIXME: We should support
			//labels in the middle of
			//these, but we don't.
			uint8_t val;
			if (!input.consume_hex_byte(val))
			{
				input.parse_error("Expected hex bytes in array of bytes");
				valid = false;
				return;
			}
			v.byte_data.push_back(val);
			input.next_token();
		}
	}
	values.push_back(v);
}